

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O0

bool __thiscall
QUtcTimeZonePrivate::isTimeZoneIdAvailable(QUtcTimeZonePrivate *this,QByteArray *ianaId)

{
  long lVar1;
  QByteArrayView ianaIds;
  QByteArrayView id;
  bool bVar2;
  qsizetype in_RSI;
  storage_type *in_RDI;
  long in_FS_OFFSET;
  UtcData *data;
  UtcData *__end1;
  UtcData *__begin1;
  UtcData (*__range1) [42];
  UtcData *this_00;
  QByteArrayView in_stack_ffffffffffffffa0;
  QByteArrayView *local_40;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  storage_type *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = (QByteArrayView *)QtTimeZoneCldr::utcDataTable;
  do {
    this_00 = (UtcData *)in_stack_ffffffffffffffa0.m_size;
    if (local_40 == (QByteArrayView *)&DAT_00a06370) {
      bVar2 = false;
LAB_0073d38f:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return bVar2;
      }
      __stack_chk_fail();
    }
    QByteArrayView::QByteArrayView<QByteArray,_true>
              (local_40,(QByteArray *)in_stack_ffffffffffffffa0.m_data);
    in_stack_ffffffffffffffa0 = QtTimeZoneCldr::UtcData::id(this_00);
    id.m_size._7_1_ = in_stack_ffffffffffffffe7;
    id.m_size._0_7_ = in_stack_ffffffffffffffe0;
    id.m_data = in_stack_ffffffffffffffe8;
    ianaIds.m_data = in_RDI;
    ianaIds.m_size = in_RSI;
    bVar2 = isEntryInIanaList(id,ianaIds);
    if (bVar2) {
      bVar2 = true;
      goto LAB_0073d38f;
    }
    local_40 = (QByteArrayView *)&local_40->m_data;
  } while( true );
}

Assistant:

bool QUtcTimeZonePrivate::isTimeZoneIdAvailable(const QByteArray &ianaId) const
{
    // Only the zone IDs supplied by CLDR and recognized by constructor.
    for (const UtcData &data : utcDataTable) {
        if (isEntryInIanaList(ianaId, data.id()))
            return true;
    }
    // Callers may want to || offsetFromUtcString(ianaId) != invalidSeconds(),
    // but those are technically not IANA IDs and the custom QTimeZone
    // constructor needs the return here to reflect that.
    return false;
}